

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
 __thiscall
kj::
Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
          (Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
           *this,SchemaBindingsPair *params)

{
  uint uVar1;
  RawSchema *pRVar2;
  RawSchema *pRVar3;
  bool bVar4;
  uint uVar5;
  undefined8 in_RAX;
  uint64_t *puVar6;
  uint64_t *in_RDX;
  SchemaBindingsPair *pSVar7;
  ulong uVar8;
  Scope *pSVar9;
  ArrayPtr<const_unsigned_char> s;
  uint local_38;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  pSVar7 = params;
  if (params[3].scopeBindings != (Scope *)0x0) {
    pRVar2 = params->schema;
    uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,(RawSchema *)*in_RDX);
    _local_38 = CONCAT44(local_34,uVar5);
    uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,(Scope *)in_RDX[1]);
    _local_38 = CONCAT44(uVar5,local_38);
    s.size_ = 8;
    s.ptr = (uchar *)&local_38;
    uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
    pRVar3 = params[3].schema;
    uVar8 = (ulong)((int)params[3].scopeBindings - 1U & uVar5);
    uVar1 = *(uint *)((long)&pRVar3->id + uVar8 * 8 + 4);
    pSVar7 = (SchemaBindingsPair *)(ulong)uVar1;
    if (uVar1 != 0) {
      puVar6 = &pRVar3->id + uVar8;
      do {
        if (((((int)pSVar7 != 1) && ((uint)*puVar6 == uVar5)) &&
            (pSVar7 = (SchemaBindingsPair *)(ulong)((int)pSVar7 - 2),
            (&pRVar2->id)[(long)pSVar7 * 3] == *in_RDX)) &&
           ((&pRVar2->encodedNode)[(long)pSVar7 * 3] == (word *)in_RDX[1])) {
          bVar4 = true;
          break;
        }
        pSVar9 = (Scope *)(uVar8 + 1);
        bVar4 = false;
        uVar8 = 0;
        if (pSVar9 != params[3].scopeBindings) {
          uVar8 = (ulong)pSVar9 & 0xffffffff;
        }
        puVar6 = &pRVar3->id + uVar8;
        pSVar7 = (SchemaBindingsPair *)(ulong)*(uint *)((long)puVar6 + 4);
      } while (*(uint *)((long)puVar6 + 4) != 0);
      goto LAB_001b2a61;
    }
  }
  bVar4 = false;
LAB_001b2a61:
  puVar6 = (uint64_t *)0x0;
  if (bVar4) {
    puVar6 = &params->schema->id + (long)pSVar7 * 3;
  }
  *(uint64_t **)this = puVar6;
  return (Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
          )(Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}